

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O1

int __thiscall MuxerManager::getDefaultSubTrackIdx(MuxerManager *this,SubTrackMode *mode)

{
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  int iVar5;
  const_iterator cVar6;
  ostream *poVar7;
  int iVar8;
  _Base_ptr p_Var9;
  string paramVal;
  int local_7c;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  key_type local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  pSVar1 = (this->m_metaDemuxer).m_codecInfo.
           super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->m_metaDemuxer).m_codecInfo.
           super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = -1;
  if (pSVar1 != pSVar2) {
    iVar5 = 0;
    p_Var9 = &(pSVar1->m_addParams)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      bVar3 = true;
      if ((char)(p_Var9[-2]._M_right)->_M_color == 0x53) {
        local_50.field_2._M_allocated_capacity._0_4_ = 0x61666564;
        local_50._M_string_length = 7;
        local_50.field_2._M_allocated_capacity._4_4_ = 0x746c75;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&p_Var9[-1]._M_right,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                                   local_50.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (p_Var9 == cVar6._M_node) {
          iVar5 = iVar5 + 1;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_70);
          bVar3 = false;
          local_7c = iVar5;
        }
      }
      iVar8 = local_7c;
      if (!bVar3) goto LAB_001c2378;
      p_Var4 = p_Var9 + 1;
      p_Var9 = (_Base_ptr)&p_Var9[8]._M_left;
    } while ((pointer)&p_Var4->_M_left != pSVar2);
    iVar8 = -1;
  }
LAB_001c2378:
  if (iVar8 != -1) {
    iVar5 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar5 == 0) {
      *mode = All;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        *mode = Forced;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid \'default\' parameter value for subtitle track ",
                   0x35);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ignoring",10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        sLastMsg = true;
        iVar8 = -1;
      }
    }
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return iVar8;
}

Assistant:

int MuxerManager::getDefaultSubTrackIdx(SubTrackMode& mode) const
{
    std::string paramVal;
    const auto idx = seekDefaultTrack(m_metaDemuxer.getStreamInfo(), paramVal,
                                      [](auto&& streamInfo) { return streamInfo.m_codec[0] == 'S'; });
    if (idx != -1)
    {
        if (paramVal == "all")
        {
            mode = SubTrackMode::All;
        }
        else if (paramVal == "forced")
        {
            mode = SubTrackMode::Forced;
        }
        else
        {
            LTRACE(LT_WARN, 2, "Invalid 'default' parameter value for subtitle track " << idx << ", ignoring");
            return -1;
        }
    }
    return idx;
}